

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldLiteGenerator::GenerateFieldInfo
          (ImmutableEnumFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  FieldDescriptor *pFVar1;
  OneofDescriptor *pOVar2;
  string_view terminating_string;
  bool bVar3;
  uint32_t number;
  MessageLite *pMVar4;
  EnumDescriptor *pEVar5;
  string_view var_name;
  string_view text;
  
  WriteUInt32ToUtf16CharSequence(this->descriptor_->number_,output);
  number = GetExperimentalJavaFieldType(this->descriptor_);
  WriteUInt32ToUtf16CharSequence(number,output);
  pFVar1 = this->descriptor_;
  bVar3 = FieldDescriptor::has_presence(pFVar1);
  if (bVar3) {
    if ((pFVar1->field_0x3 & 1) != 0) {
      if ((pFVar1->field_0x1 & 0x10) == 0) {
        protobuf::internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb63);
      }
      pOVar2 = (pFVar1->scope_).containing_oneof;
      if (pOVar2 == (OneofDescriptor *)0x0) {
        protobuf::internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb31);
      }
      if ((pOVar2->field_count_ != 1) || ((pOVar2->fields_->field_0x1 & 2) == 0)) goto LAB_00372a7a;
      GenerateFieldInfo();
    }
    WriteUInt32ToUtf16CharSequence(this->messageBitIndex_,output);
  }
LAB_00372a7a:
  text._M_str = "\"$name$_\",\n";
  text._M_len = 0xb;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,text);
  pFVar1 = this->descriptor_;
  pMVar4 = protobuf::internal::ExtensionSet::GetMessage
                     (&(pFVar1->merged_features_->field_0)._impl_._extensions_,pb::java,
                      (MessageLite *)PTR__JavaFeatures_default_instance__00832a20);
  if ((*(char *)((long)&pMVar4[1]._internal_metadata_.ptr_ + 4) == '\0') &&
     (pEVar5 = FieldDescriptor::enum_type(pFVar1), pEVar5 != (EnumDescriptor *)0x0)) {
    pEVar5 = FieldDescriptor::enum_type(pFVar1);
    bVar3 = EnumDescriptor::is_closed(pEVar5);
    if (!bVar3) {
      return;
    }
  }
  terminating_string._M_str = ",\n";
  terminating_string._M_len = 2;
  var_name._M_str = "$type$";
  var_name._M_len = 6;
  PrintEnumVerifierLogic
            (printer,this->descriptor_,&this->variables_,var_name,terminating_string,
             (this->context_->options_).enforce_lite);
  return;
}

Assistant:

void ImmutableEnumFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16_t>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  if (HasHasbit(descriptor_)) {
    WriteIntToUtf16CharSequence(messageBitIndex_, output);
  }
  printer->Print(variables_, "\"$name$_\",\n");
  if (!SupportUnknownEnumValue((descriptor_))) {
    PrintEnumVerifierLogic(printer, descriptor_, variables_,
                           /*var_name=*/"$type$",
                           /*terminating_string=*/",\n",
                           /*enforce_lite=*/context_->EnforceLite());
  }
}